

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O2

void cf2_glyphpath_lineTo(CF2_GlyphPath glyphpath,CF2_F16Dot16 x,CF2_F16Dot16 y)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  FT_Vector start;
  FT_Vector nextP1;
  FT_Vector P0;
  CF2_F16Dot16 yOffset;
  CF2_F16Dot16 xOffset;
  FT_Vector local_48;
  int local_38;
  int local_34;
  
  if (glyphpath->hintMask->isNew == '\0') {
    bVar3 = false;
  }
  else {
    bVar3 = glyphpath->pathIsClosing == '\0';
  }
  lVar1 = (glyphpath->currentCS).x;
  lVar2 = (glyphpath->currentCS).y;
  if ((lVar1 != x) || (lVar2 != y || bVar3)) {
    cf2_glyphpath_computeOffset
              (glyphpath,(CF2_F16Dot16)lVar1,(CF2_F16Dot16)lVar2,x,y,&local_34,&local_38);
    start.x = (long)((int)(glyphpath->currentCS).x + local_34);
    start.y = (long)((int)(glyphpath->currentCS).y + local_38);
    lVar1 = (long)(local_34 + x);
    lVar2 = (long)(local_38 + y);
    local_48.x = start.x;
    local_48.y = start.y;
    if (glyphpath->moveIsPending != '\0') {
      cf2_glyphpath_pushMove(glyphpath,start);
      glyphpath->moveIsPending = '\0';
      glyphpath->pathIsOpen = '\x01';
      (glyphpath->offsetStart1).x = lVar1;
      (glyphpath->offsetStart1).y = lVar2;
    }
    if (glyphpath->elemIsQueued != '\0') {
      nextP1.y = lVar2;
      nextP1.x = lVar1;
      cf2_glyphpath_pushPrevElem(glyphpath,&glyphpath->hintMap,&local_48,nextP1,'\0');
    }
    glyphpath->elemIsQueued = '\x01';
    glyphpath->prevElemOp = 2;
    (glyphpath->prevElemP0).x = local_48.x;
    (glyphpath->prevElemP0).y = local_48.y;
    (glyphpath->prevElemP1).x = lVar1;
    (glyphpath->prevElemP1).y = lVar2;
    if (bVar3) {
      cf2_hintmap_build(&glyphpath->hintMap,glyphpath->hStemHintArray,glyphpath->vStemHintArray,
                        glyphpath->hintMask,glyphpath->hintOriginY,'\0');
    }
    (glyphpath->currentCS).x = (long)x;
    (glyphpath->currentCS).y = (long)y;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cf2_glyphpath_lineTo( CF2_GlyphPath  glyphpath,
                        CF2_Fixed      x,
                        CF2_Fixed      y )
  {
    CF2_Fixed  xOffset, yOffset;
    FT_Vector  P0, P1;
    FT_Bool    newHintMap;

    /*
     * New hints will be applied after cf2_glyphpath_pushPrevElem has run.
     * In case this is a synthesized closing line, any new hints should be
     * delayed until this path is closed (`cf2_hintmask_isNew' will be
     * called again before the next line or curve).
     */

    /* true if new hint map not on close */
    newHintMap = cf2_hintmask_isNew( glyphpath->hintMask ) &&
                 !glyphpath->pathIsClosing;

    /*
     * Zero-length lines may occur in the charstring.  Because we cannot
     * compute darkening offsets or intersections from zero-length lines,
     * it is best to remove them and avoid artifacts.  However, zero-length
     * lines in CS at the start of a new hint map can generate non-zero
     * lines in DS due to hint substitution.  We detect a change in hint
     * map here and pass those zero-length lines along.
     */

    /*
     * Note: Find explicitly closed paths here with a conditional
     *       breakpoint using
     *
     *         !gp->pathIsClosing && gp->start.x == x && gp->start.y == y
     *
     */

    if ( glyphpath->currentCS.x == x &&
         glyphpath->currentCS.y == y &&
         !newHintMap                 )
      /*
       * Ignore zero-length lines in CS where the hint map is the same
       * because the line in DS will also be zero length.
       *
       * Ignore zero-length lines when we synthesize a closing line because
       * the close will be handled in cf2_glyphPath_pushPrevElem.
       */
      return;

    cf2_glyphpath_computeOffset( glyphpath,
                                 glyphpath->currentCS.x,
                                 glyphpath->currentCS.y,
                                 x,
                                 y,
                                 &xOffset,
                                 &yOffset );

    /* construct offset points */
    P0.x = ADD_INT32( glyphpath->currentCS.x, xOffset );
    P0.y = ADD_INT32( glyphpath->currentCS.y, yOffset );
    P1.x = ADD_INT32( x, xOffset );
    P1.y = ADD_INT32( y, yOffset );

    if ( glyphpath->moveIsPending )
    {
      /* emit offset 1st point as MoveTo */
      cf2_glyphpath_pushMove( glyphpath, P0 );

      glyphpath->moveIsPending = FALSE;  /* adjust state machine */
      glyphpath->pathIsOpen    = TRUE;

      glyphpath->offsetStart1 = P1;              /* record second point */
    }

    if ( glyphpath->elemIsQueued )
    {
      FT_ASSERT( cf2_hintmap_isValid( &glyphpath->hintMap ) ||
                 glyphpath->hintMap.count == 0              );

      cf2_glyphpath_pushPrevElem( glyphpath,
                                  &glyphpath->hintMap,
                                  &P0,
                                  P1,
                                  FALSE );
    }

    /* queue the current element with offset points */
    glyphpath->elemIsQueued = TRUE;
    glyphpath->prevElemOp   = CF2_PathOpLineTo;
    glyphpath->prevElemP0   = P0;
    glyphpath->prevElemP1   = P1;

    /* update current map */
    if ( newHintMap )
      cf2_hintmap_build( &glyphpath->hintMap,
                         glyphpath->hStemHintArray,
                         glyphpath->vStemHintArray,
                         glyphpath->hintMask,
                         glyphpath->hintOriginY,
                         FALSE );

    glyphpath->currentCS.x = x;     /* pre-offset current point */
    glyphpath->currentCS.y = y;
  }